

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proposal.cpp
# Opt level: O3

int __thiscall ncnn::Proposal::load_param(Proposal *this,ParamDict *pd)

{
  uint uVar1;
  void *pvVar2;
  int *piVar3;
  Allocator *pAVar4;
  Proposal *pPVar5;
  int iVar6;
  int iVar7;
  float *pfVar8;
  ulong uVar9;
  float *pfVar10;
  long lVar11;
  float *pfVar12;
  ulong uVar13;
  ulong uVar14;
  size_t sVar15;
  long lVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  undefined1 auVar20 [16];
  undefined1 extraout_var [12];
  Mat anchors;
  void *ptr;
  float *local_c8;
  float *pfStack_c0;
  size_t local_b8;
  int local_b0;
  Allocator *local_a8;
  undefined8 local_a0;
  int iStack_98;
  undefined4 uStack_94;
  size_t local_90;
  Proposal *local_80;
  ulong local_78;
  ulong local_70;
  void *local_68;
  float *local_60;
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  
  iVar6 = ParamDict::get(pd,0,0x10);
  this->feat_stride = iVar6;
  iVar6 = ParamDict::get(pd,1,0x10);
  this->base_size = iVar6;
  iVar6 = ParamDict::get(pd,2,6000);
  this->pre_nms_topN = iVar6;
  iVar6 = ParamDict::get(pd,3,300);
  this->after_nms_topN = iVar6;
  fVar17 = ParamDict::get(pd,4,0.7);
  this->nms_thresh = fVar17;
  iVar6 = ParamDict::get(pd,5,0x10);
  this->min_size = iVar6;
  iVar6 = this->base_size;
  uVar1 = (this->ratios).w;
  local_70 = (ulong)uVar1;
  iStack_98 = (this->scales).w;
  local_78 = (ulong)iStack_98;
  iStack_98 = iStack_98 * uVar1;
  local_c8 = (float *)0x0;
  pfStack_c0 = (float *)0x0;
  local_b8 = 4;
  local_b0 = 1;
  local_a8 = (Allocator *)0x0;
  local_a0 = 0x400000002;
  uStack_94 = 1;
  sVar15 = (size_t)(iStack_98 * 4);
  local_90 = sVar15;
  local_80 = this;
  if (iStack_98 != 0) {
    local_60 = (float *)0x0;
    iVar7 = posix_memalign(&local_60,0x10,sVar15 * 4 + 4);
    local_c8 = (float *)0x0;
    if (iVar7 == 0) {
      local_c8 = local_60;
    }
    pfStack_c0 = local_c8 + sVar15;
    *pfStack_c0 = 1.4013e-45;
  }
  pfVar10 = pfStack_c0;
  if (0 < (int)local_70) {
    uVar14 = local_78 & 0xffffffff;
    local_58 = (float)iVar6 * 0.5;
    local_68 = (local_80->ratios).data;
    pvVar2 = (local_80->scales).data;
    lVar11 = (long)local_a0._4_4_ * local_b8;
    lVar16 = lVar11 * local_78;
    uVar13 = 0;
    pfVar12 = local_c8;
    fStack_54 = local_58;
    fStack_50 = local_58;
    fStack_4c = local_58;
    do {
      if (0 < (int)local_78) {
        fVar17 = *(float *)((long)local_68 + uVar13 * 4);
        auVar20 = rsqrtss(ZEXT816(0),ZEXT416((uint)fVar17));
        fVar18 = auVar20._0_4_;
        fVar18 = roundf(fVar18 * -0.5 * (float)iVar6 * (fVar17 * fVar18 * fVar18 + -3.0));
        local_48 = (float)(int)fVar18;
        fStack_44 = (float)(int)extraout_var._0_4_;
        fStack_40 = (float)(int)extraout_var._4_4_;
        fStack_3c = (float)(int)extraout_var._8_4_;
        fVar17 = roundf(fVar17 * local_48);
        uVar9 = 0;
        pfVar8 = pfVar12;
        do {
          fVar18 = *(float *)((long)pvVar2 + uVar9 * 4) * 0.5;
          fVar19 = fVar18 * local_48;
          fVar18 = fVar18 * (float)(int)fVar17;
          *pfVar8 = local_58 - fVar19;
          pfVar8[1] = fStack_54 - fVar18;
          pfVar8[2] = fVar19 + fStack_50;
          pfVar8[3] = fVar18 + fStack_4c;
          uVar9 = uVar9 + 1;
          pfVar8 = (float *)((long)pfVar8 + lVar11);
        } while (uVar14 != uVar9);
      }
      uVar13 = uVar13 + 1;
      pfVar12 = (float *)((long)pfVar12 + lVar16);
    } while (uVar13 != local_70);
  }
  pPVar5 = local_80;
  if (&local_80->anchors != (Mat *)&local_c8) {
    if (pfVar10 != (float *)0x0) {
      LOCK();
      *pfVar10 = (float)((int)*pfVar10 + 1);
      UNLOCK();
    }
    piVar3 = (local_80->anchors).refcount;
    if (piVar3 != (int *)0x0) {
      LOCK();
      *piVar3 = *piVar3 + -1;
      UNLOCK();
      if (*piVar3 == 0) {
        pvVar2 = (local_80->anchors).data;
        pAVar4 = (local_80->anchors).allocator;
        if (pAVar4 == (Allocator *)0x0) {
          if (pvVar2 != (void *)0x0) {
            free(pvVar2);
          }
        }
        else {
          (*pAVar4->_vptr_Allocator[3])();
        }
      }
    }
    (pPVar5->anchors).data = local_c8;
    (pPVar5->anchors).refcount = (int *)pfStack_c0;
    (pPVar5->anchors).elemsize = local_b8;
    (pPVar5->anchors).elempack = local_b0;
    (pPVar5->anchors).allocator = local_a8;
    (pPVar5->anchors).dims = (undefined4)local_a0;
    (pPVar5->anchors).w = local_a0._4_4_;
    (pPVar5->anchors).h = iStack_98;
    (pPVar5->anchors).c = uStack_94;
    (pPVar5->anchors).cstep = local_90;
    pfVar10 = pfStack_c0;
  }
  if (pfVar10 != (float *)0x0) {
    LOCK();
    *pfVar10 = (float)((int)*pfVar10 + -1);
    UNLOCK();
    if (*pfVar10 == 0.0) {
      if (local_a8 == (Allocator *)0x0) {
        if (local_c8 != (float *)0x0) {
          free(local_c8);
        }
      }
      else {
        (*local_a8->_vptr_Allocator[3])();
      }
    }
  }
  return 0;
}

Assistant:

int Proposal::load_param(const ParamDict& pd)
{
    feat_stride = pd.get(0, 16);
    base_size = pd.get(1, 16);
    pre_nms_topN = pd.get(2, 6000);
    after_nms_topN = pd.get(3, 300);
    nms_thresh = pd.get(4, 0.7f);
    min_size = pd.get(5, 16);

//     Mat ratio;
//     Mat scale;

    anchors = generate_anchors(base_size, ratios, scales);

    return 0;
}